

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_data.cc
# Opt level: O0

covers_t re2c::cover_one<unsigned_char,unsigned_char>(FILE *input,FILE *keys,path_t *path)

{
  size_t count_00;
  size_t len_00;
  path_t *f;
  bool bVar1;
  uchar uVar2;
  u32lim_t<1073741824U> x;
  u32lim_t<1073741824U> y;
  uint32_t uVar3;
  rule_rank_t match;
  arc_t *paVar4;
  unsigned_long *puVar5;
  void *__ptr;
  size_type sVar6;
  const_reference pvVar7;
  size_t len_match;
  size_t k;
  size_t j;
  size_t width;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arc;
  size_t i_1;
  uchar *buffer;
  size_t buffer_size;
  size_type local_48;
  ulong local_40;
  size_t i;
  size_t count;
  size_t len;
  path_t *path_local;
  FILE *keys_local;
  FILE *input_local;
  covers_t size;
  
  len = (size_t)path;
  path_local = (path_t *)keys;
  keys_local = input;
  count = path_t::len(path);
  i = 0;
  for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
    paVar4 = path_t::operator[]((path_t *)len,local_40);
    local_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(paVar4);
    puVar5 = std::max<unsigned_long>(&i,&local_48);
    i = *puVar5;
  }
  x = u32lim_t<1073741824U>::from64(count);
  y = u32lim_t<1073741824U>::from64(i);
  input_local._4_4_ = ::operator*(x,y);
  bVar1 = u32lim_t<1073741824U>::overflow((u32lim_t<1073741824U> *)((long)&input_local + 4));
  if (!bVar1) {
    uVar3 = u32lim_t<1073741824U>::uint32((u32lim_t<1073741824U> *)((long)&input_local + 4));
    __ptr = operator_new__((ulong)uVar3);
    for (arc = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0; arc < count;
        arc = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((long)&(arc->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                      .super__Vector_impl_data._M_start + 1)) {
      paVar4 = path_t::operator[]((path_t *)len,(size_t)arc);
      sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(paVar4);
      for (k = 0; k < i; k = k + 1) {
        pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (paVar4,k % sVar6);
        uVar2 = to_le<unsigned_char>((uchar)*pvVar7);
        *(uchar *)((long)__ptr +
                  (long)((long)&(arc->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + k * count)) = uVar2;
      }
    }
    fwrite(__ptr,1,(ulong)uVar3,(FILE *)keys_local);
    if (__ptr != (void *)0x0) {
      operator_delete__(__ptr);
    }
    f = path_local;
    len_00 = count;
    count_00 = i;
    len_match = path_t::len_matching((path_t *)len);
    match = path_t::match((path_t *)len);
    keygen<unsigned_char>((FILE *)f,count_00,len_00,len_match,match);
  }
  return (covers_t)input_local._4_4_;
}

Assistant:

static Node::covers_t cover_one (FILE * input, FILE * keys, const path_t & path)
{
	const size_t len = path.len ();

	size_t count = 0;
	for (size_t i = 0; i < len; ++i)
	{
		count = std::max (count, path[i]->size ());
	}

	const Node::covers_t size = Node::covers_t::from64(len) * Node::covers_t::from64(count);
	if (!size.overflow ())
	{
		// input
		const size_t buffer_size = size.uint32 ();
		cunit_t * buffer = new cunit_t [buffer_size];
		for (size_t i = 0; i < len; ++i)
		{
			const std::vector<uint32_t> & arc = *path[i];
			const size_t width = arc.size ();
			for (size_t j = 0; j < count; ++j)
			{
				const size_t k = j % width;
				buffer[j * len + i] = to_le<cunit_t>(static_cast<cunit_t> (arc[k]));
			}
		}
		fwrite (buffer, sizeof (cunit_t), buffer_size, input);
		delete [] buffer;

		// keys
		keygen<key_t> (keys, count, len, path.len_matching (), path.match ());
	}

	return size;
}